

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

LogStream * __thiscall LogStream::operator<<(LogStream *this,long v)

{
  LogStream *in_RDI;
  LogStream *unaff_retaddr;
  
  formatInteger<long>(unaff_retaddr,(long)in_RDI);
  return in_RDI;
}

Assistant:

LogStream& LogStream::operator<<(long v){
    formatInteger(v);
    return *this;
}